

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_j2k_write_float_to_float64(void *p_src_data,void *p_dest_data,OPJ_UINT32 p_nb_elem)

{
  OPJ_FLOAT64 l_temp;
  float *pfStack_30;
  OPJ_UINT32 i;
  OPJ_FLOAT32 *l_src_data;
  OPJ_BYTE *l_dest_data;
  OPJ_UINT32 p_nb_elem_local;
  void *p_dest_data_local;
  void *p_src_data_local;
  
  pfStack_30 = (float *)p_src_data;
  l_src_data = (OPJ_FLOAT32 *)p_dest_data;
  for (l_temp._4_4_ = 0; l_temp._4_4_ < p_nb_elem; l_temp._4_4_ = l_temp._4_4_ + 1) {
    opj_write_double_LE((OPJ_BYTE *)l_src_data,(OPJ_FLOAT64)(double)*pfStack_30);
    l_src_data = l_src_data + 2;
    pfStack_30 = pfStack_30 + 1;
  }
  return;
}

Assistant:

static void  opj_j2k_write_float_to_float64(const void * p_src_data,
        void * p_dest_data, OPJ_UINT32 p_nb_elem)
{
    OPJ_BYTE * l_dest_data = (OPJ_BYTE *) p_dest_data;
    OPJ_FLOAT32 * l_src_data = (OPJ_FLOAT32 *) p_src_data;
    OPJ_UINT32 i;
    OPJ_FLOAT64 l_temp;

    for (i = 0; i < p_nb_elem; ++i) {
        l_temp = (OPJ_FLOAT64) * (l_src_data++);

        opj_write_double(l_dest_data, l_temp);

        l_dest_data += sizeof(OPJ_FLOAT64);
    }
}